

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::expression(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  ostream *poVar2;
  allocator local_141;
  string local_140;
  Node local_120;
  Node varNode;
  Node local_a0;
  Node local_60;
  
  lVar1 = (this->lexer).lexem.type;
  test(__return_storage_ptr__,this);
  if (lVar1 == IDENTIFIER) {
    if (__return_storage_ptr__->kind == FUNC_CALL) {
      nextLexem(this);
      if ((this->lexer).lexem.type != CPAR) {
        poVar2 = std::operator<<((ostream *)&std::cout,"\")\" expected");
        std::endl<char,std::char_traits<char>>(poVar2);
        goto LAB_0010674b;
      }
      nextLexem(this);
    }
    lVar1 = (this->lexer).lexem.type;
    if (lVar1 == EQUAL) {
      if (__return_storage_ptr__->kind != VAR) {
        if (1 < __return_storage_ptr__->kind - UN_OP_EXPR_N) {
          return __return_storage_ptr__;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,"Error. Expression is not assignable");
        std::endl<char,std::char_traits<char>>(poVar2);
LAB_0010674b:
        exit(0);
      }
      nextLexem(this);
      Node::Node(&varNode,__return_storage_ptr__);
      std::__cxx11::string::string((string *)&local_140,"",&local_141);
      Node::Node(&local_120,SET,&local_140);
      Node::operator=(__return_storage_ptr__,&local_120);
      Node::~Node(&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      Node::Node(&local_60,&varNode);
      std::vector<Node,_std::allocator<Node>_>::push_back
                (&__return_storage_ptr__->subnodes,&local_60);
      Node::~Node(&local_60);
      expression(&local_a0,this);
      std::vector<Node,_std::allocator<Node>_>::push_back
                (&__return_storage_ptr__->subnodes,&local_a0);
      Node::~Node(&local_a0);
      Node::~Node(&varNode);
      lVar1 = (this->lexer).lexem.type;
    }
    if (lVar1 == INTLITERAL) {
      std::__cxx11::string::string((string *)&local_120,(string *)&(this->lexer).lexem.value);
      Node::Node(&varNode,CONST,(string *)&local_120);
      Node::operator=(__return_storage_ptr__,&varNode);
      Node::~Node(&varNode);
      std::__cxx11::string::~string((string *)&local_120);
      nextLexem(this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::expression() {
    if (getLexemType() != IDENTIFIER) {
        return test();
    }
    Node expNode = test();
    if (expNode.getKind() == FUNC_CALL) {
        nextLexem();
        if (getLexemType() != CPAR) {
            cout << "\")\" expected" << endl;
            exit(0);
        }
        nextLexem();
    }
    if (getLexemType() == EQUAL) {
        if (expNode.getKind() == UN_OP_EXPR_L_N || expNode.getKind() == UN_OP_EXPR_N) {
            cout << "Error. Expression is not assignable" << endl;
            exit(0);
        }
        if (expNode.getKind() == VAR) {
            nextLexem();
            Node varNode = Node(expNode);
            expNode = Node(SET);
            expNode.addSubnode(varNode);
            expNode.addSubnode(expression());
        }
    }
    if (getLexemType() == INTLITERAL) {
        expNode = Node(CONST, getLexemValue());
        nextLexem();
    }
    return expNode;
}